

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::End(void)

{
  ImGuiWindow *window_00;
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindow **ppIVar3;
  ImGuiWindow *local_28;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  window_00 = GImGui->CurrentWindow;
  if (((GImGui->CurrentWindowStack).Size < 2) &&
     ((GImGui->WithinFrameScopeWithImplicitWindow & 1U) != 0)) {
    if ((GImGui->CurrentWindowStack).Size < 2) {
      __assert_fail("(g.CurrentWindowStack.Size > 1) && \"Calling End() too many times!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                    ,0x172a,"void ImGui::End()");
    }
  }
  else {
    if ((GImGui->CurrentWindowStack).Size < 1) {
      __assert_fail("g.CurrentWindowStack.Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                    ,0x172d,"void ImGui::End()");
    }
    if (((window_00->Flags & 0x1000000U) != 0) && ((GImGui->WithinEndChild & 1U) == 0)) {
      __assert_fail("(g.WithinEndChild) && \"Must call EndChild() and not End()!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                    ,0x1731,"void ImGui::End()");
    }
    if ((window_00->DC).CurrentColumns != (ImGuiColumns *)0x0) {
      EndColumns();
    }
    PopClipRect();
    if ((window_00->Flags & 0x1000000U) == 0) {
      LogFinish();
    }
    ImVector<ImGuiWindow_*>::pop_back(&pIVar1->CurrentWindowStack);
    if ((window_00->Flags & 0x4000000U) != 0) {
      ImVector<ImGuiPopupData>::pop_back(&pIVar1->BeginPopupStack);
    }
    ErrorCheckBeginEndCompareStacksSize(window_00,false);
    bVar2 = ImVector<ImGuiWindow_*>::empty(&pIVar1->CurrentWindowStack);
    if (bVar2) {
      local_28 = (ImGuiWindow *)0x0;
    }
    else {
      ppIVar3 = ImVector<ImGuiWindow_*>::back(&pIVar1->CurrentWindowStack);
      local_28 = *ppIVar3;
    }
    SetCurrentWindow(local_28);
  }
  return;
}

Assistant:

void ImGui::End()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Error checking: verify that user hasn't called End() too many times!
    if (g.CurrentWindowStack.Size <= 1 && g.WithinFrameScopeWithImplicitWindow)
    {
        IM_ASSERT_USER_ERROR(g.CurrentWindowStack.Size > 1, "Calling End() too many times!");
        return;
    }
    IM_ASSERT(g.CurrentWindowStack.Size > 0);

    // Error checking: verify that user doesn't directly call End() on a child window.
    if (window->Flags & ImGuiWindowFlags_ChildWindow)
        IM_ASSERT_USER_ERROR(g.WithinEndChild, "Must call EndChild() and not End()!");

    // Close anything that is open
    if (window->DC.CurrentColumns)
        EndColumns();
    PopClipRect();   // Inner window clip rectangle

    // Stop logging
    if (!(window->Flags & ImGuiWindowFlags_ChildWindow))    // FIXME: add more options for scope of logging
        LogFinish();

    // Pop from window stack
    g.CurrentWindowStack.pop_back();
    if (window->Flags & ImGuiWindowFlags_Popup)
        g.BeginPopupStack.pop_back();
    ErrorCheckBeginEndCompareStacksSize(window, false);
    SetCurrentWindow(g.CurrentWindowStack.empty() ? NULL : g.CurrentWindowStack.back());
}